

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Block::GetTxOutProof
          (ByteData *__return_storage_ptr__,Block *this,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  Serializer obj;
  MerkleBlock merkle_block;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_98;
  Serializer local_80;
  MerkleBlock local_58;
  
  MerkleBlock::MerkleBlock(&local_58,this,txids);
  Serializer::Serializer(&local_80);
  SerializeBlockHeader((ByteData *)&_Stack_98,this);
  Serializer::AddDirectBytes(&local_80,(ByteData *)&_Stack_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_98);
  MerkleBlock::Serialize((ByteData *)&_Stack_98,&local_58);
  Serializer::AddDirectBytes(&local_80,(ByteData *)&_Stack_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_98);
  Serializer::Output(__return_storage_ptr__,&local_80);
  Serializer::~Serializer(&local_80);
  MerkleBlock::~MerkleBlock(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const std::vector<Txid>& txids) const {
  MerkleBlock merkle_block(*this, txids);
  Serializer obj;
  obj.AddDirectBytes(SerializeBlockHeader());
  obj.AddDirectBytes(merkle_block.Serialize());
  return obj.Output();
}